

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O0

PCRE2_UCHAR16 get_repeat_base(PCRE2_UCHAR16 c)

{
  bool bVar1;
  PCRE2_UCHAR16 c_local;
  
  if (c < 0x62) {
    if (c < 0x55) {
      if (c < 0x48) {
        if (c < 0x3b) {
          bVar1 = 0x2d < c;
          c = 0x21;
          if (bVar1) {
            c = 0x2e;
          }
        }
        else {
          c = 0x3b;
        }
      }
      else {
        c = 0x48;
      }
    }
    else {
      c = 0x55;
    }
  }
  return c;
}

Assistant:

static PCRE2_UCHAR
get_repeat_base(PCRE2_UCHAR c)
{
return (c > OP_TYPEPOSUPTO)? c :
       (c >= OP_TYPESTAR)?   OP_TYPESTAR :
       (c >= OP_NOTSTARI)?   OP_NOTSTARI :
       (c >= OP_NOTSTAR)?    OP_NOTSTAR :
       (c >= OP_STARI)?      OP_STARI :
                             OP_STAR;
}